

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2coords.h
# Opt level: O0

S2Point * S2::FaceUVtoXYZ(S2Point *__return_storage_ptr__,int face,double u,double v)

{
  double v_local;
  double u_local;
  int face_local;
  
  switch(face) {
  case 0:
    Vector3<double>::Vector3(__return_storage_ptr__,1.0,u,v);
    break;
  case 1:
    Vector3<double>::Vector3(__return_storage_ptr__,-u,1.0,v);
    break;
  case 2:
    Vector3<double>::Vector3(__return_storage_ptr__,-u,-v,1.0);
    break;
  case 3:
    Vector3<double>::Vector3(__return_storage_ptr__,-1.0,-v,-u);
    break;
  case 4:
    Vector3<double>::Vector3(__return_storage_ptr__,v,-1.0,-u);
    break;
  default:
    Vector3<double>::Vector3(__return_storage_ptr__,v,u,-1.0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline S2Point FaceUVtoXYZ(int face, double u, double v) {
  switch (face) {
    case 0:  return S2Point( 1,  u,  v);
    case 1:  return S2Point(-u,  1,  v);
    case 2:  return S2Point(-u, -v,  1);
    case 3:  return S2Point(-1, -v, -u);
    case 4:  return S2Point( v, -1, -u);
    default: return S2Point( v,  u, -1);
  }
}